

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeColRange(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int start,int end,int *perm)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  uint n;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int *local_40;
  undefined8 local_38;
  
  auVar2 = _DAT_003561b0;
  if (perm == (int *)0x0) {
    iVar7 = end - start;
    uVar1 = iVar7 + 1;
    local_40 = (int *)0x0;
    local_38 = 0x3ff3333333333333;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    n = 1;
    if (-1 < iVar7) {
      n = uVar3;
    }
    spx_alloc<int*>(&local_40,n);
    if (-1 < iVar7) {
      uVar6 = (ulong)uVar1;
      do {
        uVar6 = uVar6 - 1;
        local_40[uVar6 & 0xffffffff] = end;
        iVar7 = end - start;
        end = end + -1;
      } while (1 < iVar7 + 1);
    }
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x19])(this,local_40,(ulong)uVar1,0,in_R8,in_R9,uVar3);
    if (local_40 != (int *)0x0) {
      free(local_40);
    }
    return;
  }
  if (start < 1) {
    start = 0;
  }
  else {
    lVar5 = (ulong)(uint)start - 1;
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_003561b0;
    auVar9 = _DAT_003561a0;
    do {
      auVar10 = auVar9 ^ auVar2;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        perm[uVar6] = (int)uVar6;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        perm[uVar6 + 1] = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar5 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar5 + 2;
    } while ((start + 1U & 0xfffffffe) != uVar6);
  }
  if (start <= end) {
    memset(perm + (uint)start,0xff,(ulong)(uint)(end - start) * 4 + 4);
    start = end + 1;
  }
  if (start < (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
    puVar4 = (uint *)(perm + (uint)start);
    do {
      *puVar4 = start;
      start = start + 1;
      puVar4 = puVar4 + 1;
    } while (start < (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x17])(this,perm);
  return;
}

Assistant:

virtual void removeColRange(int start, int end, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         int i = end - start + 1;
         DataArray < int > p(i);

         while(--i >= 0)
            p[i] = start + i;

         removeCols(p.get_ptr(), end - start + 1);
         return;
      }

      int i;

      for(i = 0; i < start; ++i)
         perm[i] = i;

      for(; i <= end; ++i)
         perm[i] = -1;

      for(; i < nCols(); ++i)
         perm[i] = i;

      removeCols(perm);
   }